

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O3

void __thiscall ConfigurationTest::SetUp(ConfigurationTest *this)

{
  bool bVar1;
  ulong __val;
  char cVar2;
  char cVar3;
  long lVar4;
  long *plVar5;
  runtime_error *this_00;
  ulong uVar6;
  long *plVar7;
  string *__rhs;
  string __str;
  ofstream of;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long *local_228;
  long local_220;
  long local_218;
  long lStack_210;
  ios_base local_130 [264];
  
  lVar4 = std::chrono::_V2::system_clock::now();
  __val = lVar4 / 1000;
  cVar3 = '\x01';
  if (9 < __val) {
    uVar6 = __val;
    cVar2 = '\x04';
    do {
      cVar3 = cVar2;
      if (uVar6 < 100) {
        cVar3 = cVar3 + -2;
        goto LAB_00121cdf;
      }
      if (uVar6 < 1000) {
        cVar3 = cVar3 + -1;
        goto LAB_00121cdf;
      }
      if (uVar6 < 10000) goto LAB_00121cdf;
      bVar1 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar2 = cVar3 + '\x04';
    } while (bVar1);
    cVar3 = cVar3 + '\x01';
  }
LAB_00121cdf:
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_248,cVar3);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_248._M_dataplus._M_p,(uint)local_248._M_string_length,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,0x14b611);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_218 = *plVar7;
    lStack_210 = plVar5[3];
    local_228 = &local_218;
  }
  else {
    local_218 = *plVar7;
    local_228 = (long *)*plVar5;
  }
  local_220 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __rhs = &this->filename;
  std::__cxx11::string::operator=((string *)__rhs,(string *)&local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,local_218 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_228,(string *)__rhs,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_228,(anonymous_namespace)::propertyFileContent_abi_cxx11_,
               DAT_0015f610);
    std::ofstream::close();
    setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT","123456",1);
    setenv("AERON_ARCHIVE_CONTROL_CHANNEL","qqqwwweee",1);
    setenv("AERON_ARCHIVE_CONTROL_STREAM_ID","42",1);
    setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL","ipc:aeron",1);
    setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID","314",1);
    setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL","ResponsEconTrol",1);
    setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID","271",1);
    setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL","aaaaassss",1);
    setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID","144",1);
    setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE","0",1);
    setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH","1024",1);
    setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH","1812",1);
    local_228 = _VTT;
    *(undefined8 *)((long)&local_228 + _VTT[-3]) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&local_220);
    std::ios_base::~ios_base(local_130);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_248,"Can\'t create a temporary file: ",__rhs);
  std::runtime_error::runtime_error(this_00,(string *)&local_248);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SetUp() override {
        using namespace std::chrono;

        // generate an almost unique filename
        std::uint64_t ts = duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
        filename = "ConfigurationTest." + std::to_string(ts);

        std::ofstream of(filename);
        if (!of.is_open()) {
            throw std::runtime_error("Can't create a temporary file: " + filename);
        }

        of << propertyFileContent;
        of.close();

        // set env variables
        setenv("AERON_ARCHIVE_MESSAGE_TIMEOUT", "123456", 1);
        setenv("AERON_ARCHIVE_CONTROL_CHANNEL", "qqqwwweee", 1);
        setenv("AERON_ARCHIVE_CONTROL_STREAM_ID", "42", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_CHANNEL", "ipc:aeron", 1);
        setenv("AERON_ARCHIVE_LOCAL_CONTROL_STREAM_ID", "314", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_CHANNEL", "ResponsEconTrol", 1);
        setenv("AERON_ARCHIVE_CONTROL_RESPONSE_STREAM_ID", "271", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_CHANNEL", "aaaaassss", 1);
        setenv("AERON_ARCHIVE_RECORDING_EVENTS_STREAM_ID", "144", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_SPARSE", "0", 1);
        setenv("AERON_ARCHIVE_CONTROL_TERM_BUFFER_LENGTH", "1024", 1);
        setenv("AERON_ARCHIVE_CONTROL_MTU_LENGTH", "1812", 1);
    }